

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OtherVisitor.cpp
# Opt level: O0

void __thiscall OpenMD::XYZVisitor::update(XYZVisitor *this)

{
  bool bVar1;
  SelectionEvaluator *in_RDI;
  SelectionManager *in_stack_ffffffffffffffd0;
  SelectionEvaluator *this_00;
  
  this_00 = in_RDI;
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)&(in_RDI->compiler).ichCurrentCommand)
  ;
  if (bVar1) {
    SelectionEvaluator::evaluate(this_00);
    SelectionManager::setSelectionSet(in_stack_ffffffffffffffd0,(SelectionSet *)in_RDI);
    SelectionSet::~SelectionSet((SelectionSet *)0x34d4d5);
  }
  return;
}

Assistant:

void XYZVisitor::update() {
    // if dynamic, we need to re-evaluate the selection
    if (evaluator.isDynamic()) {
      seleMan.setSelectionSet(evaluator.evaluate());
    }
  }